

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

_Bool av1_hash_table_create(hash_table *p_hash_table)

{
  Vector **ppVVar1;
  hash_table *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var2;
  
  if (in_RDI->p_lookup_table == (Vector **)0x0) {
    ppVVar1 = (Vector **)
              aom_calloc(CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         (size_t)in_RDI);
    in_RDI->p_lookup_table = ppVVar1;
    if (in_RDI->p_lookup_table == (Vector **)0x0) {
      _Var2 = false;
    }
    else {
      _Var2 = true;
    }
  }
  else {
    clear_all(in_RDI);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool av1_hash_table_create(hash_table *p_hash_table) {
  if (p_hash_table->p_lookup_table != NULL) {
    clear_all(p_hash_table);
    return true;
  }
  p_hash_table->p_lookup_table =
      (Vector **)aom_calloc(kMaxAddr, sizeof(p_hash_table->p_lookup_table[0]));
  if (!p_hash_table->p_lookup_table) return false;
  return true;
}